

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckLineLength.cxx
# Opt level: O1

bool __thiscall
kws::Parser::CheckLineLength(Parser *this,unsigned_long max,bool checkHeader,bool doErrorCheck)

{
  string *psVar1;
  pointer puVar2;
  ulong uVar3;
  iterator iVar4;
  char cVar5;
  char *__s;
  ostream *poVar6;
  undefined7 in_register_00000009;
  unsigned_long uVar7;
  byte bVar8;
  bool bVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  char localval [21];
  ifstream file;
  unsigned_long local_288;
  ulong local_280;
  undefined4 local_274;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_270;
  unsigned_long local_268;
  unsigned_long local_260;
  char local_258 [32];
  value_type local_238 [9];
  
  local_274 = (undefined4)CONCAT71(in_register_00000009,doErrorCheck);
  this->m_TestsDone[0] = true;
  __s = (char *)operator_new__(0xff);
  local_268 = max;
  snprintf(__s,0xff,"Line Length = %ld max chars",max);
  pcVar10 = (char *)this->m_TestsDescription[0]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)this->m_TestsDescription,0,pcVar10,(ulong)__s);
  operator_delete__(__s);
  puVar2 = (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (checkHeader) {
    local_280 = 0;
  }
  else if ((this->m_HeaderFilename)._M_string_length == 0) {
    local_280 = std::__cxx11::string::find((char *)&this->m_Buffer,0x16b540,0);
    if (local_280 == 0xffffffffffffffff) {
      local_280 = 0;
    }
  }
  else {
    std::ifstream::ifstream(local_238);
    std::ifstream::open((char *)local_238,(_Ios_Openmode)(this->m_HeaderFilename)._M_dataplus._M_p);
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"CheckLineLength() - Cannot open file: ",0x26);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->m_HeaderFilename)._M_dataplus._M_p,
                          (this->m_HeaderFilename)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_280 = 0;
    }
    else {
      std::istream::seekg((long)local_238,_S_beg);
      local_280 = std::istream::tellg();
      std::ifstream::close();
    }
    std::ifstream::~ifstream(local_238);
  }
  this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->m_Positions;
  pcVar10 = (this->m_Buffer)._M_dataplus._M_p;
  uVar3 = (this->m_Buffer)._M_string_length;
  local_238[0].line = 0;
  iVar4._M_current =
       (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,iVar4,
               &local_238[0].line);
  }
  else {
    *iVar4._M_current = 0;
    (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  local_288 = 0;
  if (uVar3 == 0) {
    bVar9 = true;
  }
  else {
    uVar7 = 1;
    bVar8 = 0;
    uVar12 = 0;
    local_270 = this_00;
    do {
      if (*pcVar10 == '\n') {
        iVar4._M_current =
             (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_270,iVar4,&local_288);
        }
        else {
          *iVar4._M_current = local_288;
          (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        if ((((char)local_274 != '\0') && (lVar11 = ~uVar12 + local_288, (long)local_268 < lVar11))
           && (local_280 < local_288)) {
          local_238[0].description._M_dataplus._M_p = (pointer)&local_238[0].description.field_2;
          local_238[0].description._M_string_length = 0;
          local_238[0].description.field_2._M_local_buf[0] = '\0';
          local_238[0].number = 0;
          psVar1 = &local_238[0].description;
          local_260 = uVar7;
          local_238[0].line = uVar7;
          local_238[0].line2 = uVar7;
          std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)0x0,0x178107);
          snprintf(local_258,0x15,"%ld",lVar11);
          std::__cxx11::string::append((char *)psVar1);
          std::__cxx11::string::append((char *)psVar1);
          snprintf(local_258,0x15,"%ld",local_268);
          std::__cxx11::string::append((char *)psVar1);
          std::__cxx11::string::append((char *)psVar1);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238[0].description._M_dataplus._M_p != &local_238[0].description.field_2) {
            operator_delete(local_238[0].description._M_dataplus._M_p);
          }
          bVar8 = 1;
          uVar7 = local_260;
        }
        uVar12 = local_288 + 1;
        uVar7 = uVar7 + 1;
      }
      pcVar10 = pcVar10 + 1;
      local_288 = local_288 + 1;
    } while (local_288 < uVar3);
    bVar9 = (bool)(bVar8 ^ 1);
    this_00 = local_270;
  }
  iVar4._M_current =
       (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>(this_00,iVar4,&local_288);
  }
  else {
    *iVar4._M_current = local_288;
    (this->m_Positions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  return bVar9;
}

Assistant:

bool Parser::CheckLineLength(unsigned long max,bool checkHeader, bool doErrorCheck)
{
  m_TestsDone[LINE_LENGTH] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Line Length = %ld max chars",max);
  m_TestsDescription[LINE_LENGTH] = val;
  delete [] val;

  m_Positions.clear();
  bool hasError = false;

  size_t fileSize = 0;

  // If we do not want to check the header
  if(!checkHeader)
    {
    if (!m_HeaderFilename.empty()) {
      std::ifstream file;
      file.open(m_HeaderFilename.c_str(), std::ios::binary | std::ios::in);
      if(!file.is_open())
        {
        std::cout << "CheckLineLength() - Cannot open file: "
                  << m_HeaderFilename << std::endl;
        }
      else
        {
        file.seekg(0,std::ios::end);
        fileSize = file.tellg();
        file.close();
        }
    } else {
      // we look at the first '*/' in the file which indicated the end of the current header
      // This assume that there is an header at some point
      size_t endHeader = m_Buffer.find("*/",0);
      if(endHeader != std::string::npos)
        {
        fileSize = endHeader;
        }
    }
    }

  size_t cc;
  const char* inch = m_Buffer.c_str();
  size_t inStrSize = m_Buffer.size();
  long int line_start = 0;
  long int line_end = 0;
  long int line_count = 1;
  m_Positions.push_back(0);
  for ( cc = 0; cc < inStrSize; ++ cc )
    {
    if ( *inch == '\n' )
      {
      m_Positions.push_back(cc);
      line_end = static_cast<long int>(cc);
      long int line_length = line_end - line_start-1;
      if(doErrorCheck && (line_length > (long int)max && cc>fileSize))
        {
        Error error;
        error.line = line_count;
        error.line2 = error.line;
        error.number = LINE_LENGTH;
        error.description = "Line length exceed ";
        constexpr size_t length = 21;
        char localval[length];
        snprintf(localval,length,"%ld",line_length);
        error.description += localval;
        error.description += " (max=";
        snprintf(localval,length,"%ld",max);
        error.description += localval;
        error.description += ")";
        m_ErrorList.push_back(error);
        hasError = true;
        }
      line_start = static_cast<long int>(cc) + 1;
      line_count ++;
      }
    inch ++;
    }
  m_Positions.push_back(cc);

  return !hasError;
}